

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_build_dummy_sampler_for_combined_images(spvc_compiler compiler,spvc_variable_id *id)

{
  uint32_t uVar1;
  pointer this;
  exception *e;
  uint32_t local_24;
  uint32_t *local_20;
  spvc_variable_id *id_local;
  spvc_compiler compiler_local;
  
  local_20 = id;
  id_local = (spvc_variable_id *)compiler;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  local_24 = (uint32_t)spirv_cross::Compiler::build_dummy_sampler_for_combined_images(this);
  uVar1 = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)&local_24);
  *local_20 = uVar1;
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_build_dummy_sampler_for_combined_images(spvc_compiler compiler, spvc_variable_id *id)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		*id = compiler->compiler->build_dummy_sampler_for_combined_images();
	}